

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_request.c
# Opt level: O2

int tnt_request_set_exprz(tnt_request *req,char *expr)

{
  int iVar1;
  size_t sVar2;
  
  iVar1 = -1;
  if ((expr != (char *)0x0) && ((req->hdr).type == TNT_OP_EVAL)) {
    req->key = expr;
    sVar2 = strlen(expr);
    req->key_end = expr + sVar2;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int
tnt_request_set_exprz(struct tnt_request *req, const char *expr)
{
	if (req->hdr.type != TNT_OP_EVAL)
		return -1;
	if (!expr)
		return -1;
	req->key = expr; req->key_end = req->key + strlen(req->key);
	return 0;
}